

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_buffer.c
# Opt level: O0

void test_cio_write_buffer_peek_and_last(void)

{
  size_t sVar1;
  cio_write_buffer *pcVar2;
  cio_write_buffer *last;
  cio_write_buffer *peek;
  cio_write_buffer wb2;
  char cStack_60;
  char cStack_5f;
  char cStack_5e;
  char data2 [13];
  cio_write_buffer wb1;
  uint data1;
  size_t num_elements;
  cio_write_buffer wbh;
  
  cio_write_buffer_head_init((cio_write_buffer *)&num_elements);
  sVar1 = cio_write_buffer_get_num_buffer_elements((cio_write_buffer *)&num_elements);
  UnityAssertEqualNumber
            (0,sVar1,
             "Number of elements in write buffer not \'0\' after initialization of write buffer head!"
             ,0xa1,UNITY_DISPLAY_STYLE_INT);
  wb1.data.element.length._4_4_ = 0x12;
  cio_write_buffer_element_init((cio_write_buffer *)(data2 + 5),(void *)((long)&wb1.data + 0xc),4);
  cio_write_buffer_queue_tail((cio_write_buffer *)&num_elements,(cio_write_buffer *)(data2 + 5));
  sVar1 = cio_write_buffer_get_num_buffer_elements((cio_write_buffer *)&num_elements);
  UnityAssertEqualNumber
            (1,sVar1,"Number of elements in write buffer not \'1\' after inserting first element!",
             0xa8,UNITY_DISPLAY_STYLE_INT);
  wb2.data._11_1_ = 'H';
  wb2.data._12_1_ = 'e';
  wb2.data._13_1_ = 'l';
  wb2.data._14_1_ = 'l';
  wb2.data._15_1_ = 'o';
  cStack_60 = ' ';
  cStack_5f = 'W';
  cStack_5e = 'o';
  builtin_strncpy(data2,"rld!",5);
  cio_write_buffer_const_element_init((cio_write_buffer *)&peek,(void *)((long)&wb2.data + 0xb),0xd)
  ;
  cio_write_buffer_queue_tail((cio_write_buffer *)&num_elements,(cio_write_buffer *)&peek);
  sVar1 = cio_write_buffer_get_num_buffer_elements((cio_write_buffer *)&num_elements);
  UnityAssertEqualNumber
            (2,sVar1,"Number of elements in write buffer not \'2\' after inserting second element!",
             0xaf,UNITY_DISPLAY_STYLE_INT);
  pcVar2 = cio_write_buffer_queue_peek((cio_write_buffer *)&num_elements);
  UnityAssertEqualNumber
            ((UNITY_INT)(data2 + 5),(UNITY_INT)pcVar2,
             "Peek() gave not the write buffer inserted first!",0xb2,UNITY_DISPLAY_STYLE_INT);
  sVar1 = cio_write_buffer_get_num_buffer_elements((cio_write_buffer *)&num_elements);
  UnityAssertEqualNumber
            (2,sVar1,"Number of elements changed after peek()!",0xb4,UNITY_DISPLAY_STYLE_INT);
  sVar1 = cio_write_buffer_get_total_size((cio_write_buffer *)&num_elements);
  UnityAssertEqualNumber
            (0x11,sVar1,"Write buffer total length not correct!",0xb5,UNITY_DISPLAY_STYLE_INT);
  pcVar2 = cio_write_buffer_queue_last((cio_write_buffer *)&num_elements);
  UnityAssertEqualNumber
            ((UNITY_INT)&peek,(UNITY_INT)pcVar2,"Last() gave not the write buffer inserted last!",
             0xb8,UNITY_DISPLAY_STYLE_INT);
  sVar1 = cio_write_buffer_get_num_buffer_elements((cio_write_buffer *)&num_elements);
  UnityAssertEqualNumber
            (2,sVar1,"Number of elements changed after last()!",0xba,UNITY_DISPLAY_STYLE_INT);
  sVar1 = cio_write_buffer_get_total_size((cio_write_buffer *)&num_elements);
  UnityAssertEqualNumber
            (0x11,sVar1,"Write buffer total length not correct!",0xbb,UNITY_DISPLAY_STYLE_INT);
  return;
}

Assistant:

static void test_cio_write_buffer_peek_and_last(void)
{
	struct cio_write_buffer wbh;
	cio_write_buffer_head_init(&wbh);
	size_t num_elements = cio_write_buffer_get_num_buffer_elements(&wbh);
	TEST_ASSERT_EQUAL_MESSAGE(0, num_elements, "Number of elements in write buffer not '0' after initialization of write buffer head!");

	unsigned int data1 = 0x12;
	struct cio_write_buffer wb1;
	cio_write_buffer_element_init(&wb1, &data1, sizeof(data1));
	cio_write_buffer_queue_tail(&wbh, &wb1);
	num_elements = cio_write_buffer_get_num_buffer_elements(&wbh);
	TEST_ASSERT_EQUAL_MESSAGE(1, num_elements, "Number of elements in write buffer not '1' after inserting first element!");

	const char data2[] = "Hello World!";
	struct cio_write_buffer wb2;
	cio_write_buffer_const_element_init(&wb2, data2, sizeof(data2));
	cio_write_buffer_queue_tail(&wbh, &wb2);
	num_elements = cio_write_buffer_get_num_buffer_elements(&wbh);
	TEST_ASSERT_EQUAL_MESSAGE(2, num_elements, "Number of elements in write buffer not '2' after inserting second element!");

	struct cio_write_buffer *peek = cio_write_buffer_queue_peek(&wbh);
	TEST_ASSERT_EQUAL_MESSAGE(&wb1, peek, "Peek() gave not the write buffer inserted first!");
	num_elements = cio_write_buffer_get_num_buffer_elements(&wbh);
	TEST_ASSERT_EQUAL_MESSAGE(2, num_elements, "Number of elements changed after peek()!");
	TEST_ASSERT_EQUAL_MESSAGE(sizeof(data1) + sizeof(data2), cio_write_buffer_get_total_size(&wbh), "Write buffer total length not correct!");

	struct cio_write_buffer *last = cio_write_buffer_queue_last(&wbh);
	TEST_ASSERT_EQUAL_MESSAGE(&wb2, last, "Last() gave not the write buffer inserted last!");
	num_elements = cio_write_buffer_get_num_buffer_elements(&wbh);
	TEST_ASSERT_EQUAL_MESSAGE(2, num_elements, "Number of elements changed after last()!");
	TEST_ASSERT_EQUAL_MESSAGE(sizeof(data1) + sizeof(data2), cio_write_buffer_get_total_size(&wbh), "Write buffer total length not correct!");
}